

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smart_ptr.h
# Opt level: O0

smart_ptr<re2c::DFA> * __thiscall
re2c::smart_ptr<re2c::DFA>::operator=(smart_ptr<re2c::DFA> *this,smart_ptr<re2c::DFA> *p)

{
  smart_ptr<re2c::DFA> *p_local;
  smart_ptr<re2c::DFA> *this_local;
  
  if (this != p) {
    dispose(this);
    this->ptr = p->ptr;
    this->count = p->count;
    *this->count = *this->count + 1;
  }
  return this;
}

Assistant:

smart_ptr<T>& operator= (const smart_ptr<T>& p)
		{
			if (this != &p) 
			{
					dispose();
					ptr = p.ptr;
					count = p.count;
					++*count;
			}
			return *this;
		}